

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O0

void __thiscall
TPZMatrixSolver<std::complex<float>_>::SetMatrix
          (TPZMatrixSolver<std::complex<float>_> *this,TPZAutoPointer<TPZBaseMatrix> *Refmat)

{
  TPZAutoPointer<TPZBaseMatrix> *in_RDI;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_00000008;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_ffffffffffffffb8;
  
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer(in_RDI,in_stack_ffffffffffffffb8);
  TPZAutoPointerDynamicCast<TPZMatrix<std::complex<float>>,TPZBaseMatrix>(in_stack_00000008);
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator=
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_RDI,
             (TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)in_RDI);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(in_RDI);
  return;
}

Assistant:

virtual void SetMatrix(TPZAutoPointer<TPZBaseMatrix> Refmat)
    {
        fContainer = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(Refmat);
    }